

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O2

void aom_blend_a64_mask_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,int subw,int subh
               )

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint8_t *puVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  __m256i alVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m256i v_m0_b;
  uint8_t *local_138;
  char cStack_bc;
  __m256i local_a0;
  undefined1 local_80 [32];
  ulong local_60;
  
  auVar12 = _DAT_00468b70;
  uVar9 = (ulong)mask_stride;
  if (((h | w) & 3U) == 0) {
    cStack_bc = (char)(w >> 0x1f);
    if ((subh & subw) == 0) {
      if (subw == 0) {
        if (subh == 0) {
          uVar6 = (ulong)src0_stride;
          uVar7 = (ulong)src1_stride;
          if (w == 4) {
            auVar12[8] = 0x40;
            auVar12._0_8_ = 0x4040404040404040;
            auVar12[9] = 0x40;
            auVar12[10] = 0x40;
            auVar12[0xb] = 0x40;
            auVar12[0xc] = 0x40;
            auVar12[0xd] = 0x40;
            auVar12[0xe] = 0x40;
            auVar12[0xf] = 0x40;
            auVar32._8_2_ = 0x200;
            auVar32._0_8_ = 0x200020002000200;
            auVar32._10_2_ = 0x200;
            auVar32._12_2_ = 0x200;
            auVar32._14_2_ = 0x200;
            do {
              auVar50 = vpsubb_avx(auVar12,ZEXT416(*(uint *)mask));
              auVar31 = vpunpcklbw_avx(ZEXT416(*(uint *)src0),ZEXT416(*(uint *)src1));
              auVar50 = vpunpcklbw_avx(ZEXT416(*(uint *)mask),auVar50);
              auVar50 = vpmaddubsw_avx(auVar31,auVar50);
              auVar50 = vpmulhrsw_avx(auVar50,auVar32);
              auVar50 = vpackuswb_avx(auVar50,auVar50);
              *(int *)dst = auVar50._0_4_;
              dst = dst + dst_stride;
              src0 = (uint8_t *)((long)src0 + uVar6);
              src1 = (uint8_t *)((long)src1 + uVar7);
              mask = (uint8_t *)((long)mask + uVar9);
              h = h + -1;
            } while (h != 0);
          }
          else if (w == 8) {
            auVar50[8] = 0x40;
            auVar50._0_8_ = 0x4040404040404040;
            auVar50[9] = 0x40;
            auVar50[10] = 0x40;
            auVar50[0xb] = 0x40;
            auVar50[0xc] = 0x40;
            auVar50[0xd] = 0x40;
            auVar50[0xe] = 0x40;
            auVar50[0xf] = 0x40;
            auVar31._8_2_ = 0x200;
            auVar31._0_8_ = 0x200020002000200;
            auVar31._10_2_ = 0x200;
            auVar31._12_2_ = 0x200;
            auVar31._14_2_ = 0x200;
            do {
              auVar36._8_8_ = 0;
              auVar36._0_8_ = *(ulong *)mask;
              auVar12 = vpsubb_avx(auVar50,auVar36);
              auVar49._8_8_ = 0;
              auVar49._0_8_ = *(ulong *)src0;
              auVar54._8_8_ = 0;
              auVar54._0_8_ = *(ulong *)src1;
              auVar32 = vpunpcklbw_avx(auVar49,auVar54);
              auVar12 = vpunpcklbw_avx(auVar36,auVar12);
              auVar12 = vpmaddubsw_avx(auVar32,auVar12);
              auVar12 = vpmulhrsw_avx(auVar12,auVar31);
              auVar12 = vpackuswb_avx(auVar12,auVar12);
              *(long *)dst = auVar12._0_8_;
              dst = dst + dst_stride;
              src0 = (uint8_t *)((long)src0 + uVar6);
              src1 = (uint8_t *)((long)src1 + uVar7);
              mask = (uint8_t *)((long)mask + uVar9);
              h = h + -1;
            } while (h != 0);
          }
          else if (w == 0x10) {
            auVar15[8] = 0x40;
            auVar15._0_8_ = 0x4040404040404040;
            auVar15[9] = 0x40;
            auVar15[10] = 0x40;
            auVar15[0xb] = 0x40;
            auVar15[0xc] = 0x40;
            auVar15[0xd] = 0x40;
            auVar15[0xe] = 0x40;
            auVar15[0xf] = 0x40;
            auVar28._8_2_ = 0x200;
            auVar28._0_8_ = 0x200020002000200;
            auVar28._10_2_ = 0x200;
            auVar28._12_2_ = 0x200;
            auVar28._14_2_ = 0x200;
            do {
              auVar12 = *(undefined1 (*) [16])mask;
              auVar50 = vpsubb_avx(auVar15,auVar12);
              auVar32 = vpunpcklbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
              auVar31 = vpunpcklbw_avx(auVar12,auVar50);
              auVar32 = vpmaddubsw_avx(auVar32,auVar31);
              auVar31 = vpunpckhbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
              auVar12 = vpunpckhbw_avx(auVar12,auVar50);
              auVar12 = vpmaddubsw_avx(auVar31,auVar12);
              auVar32 = vpmulhrsw_avx(auVar32,auVar28);
              auVar12 = vpmulhrsw_avx(auVar12,auVar28);
              auVar12 = vpackuswb_avx(auVar32,auVar12);
              *(undefined1 (*) [16])dst = auVar12;
              dst = *(undefined1 (*) [16])dst + dst_stride;
              src0 = *(undefined1 (*) [16])src0 + uVar6;
              src1 = *(undefined1 (*) [16])src1 + uVar7;
              mask = *(undefined1 (*) [16])mask + uVar9;
              h = h + -1;
            } while (h != 0);
          }
          else {
            do {
              uVar6 = (ulong)src1_stride;
              for (lVar10 = 0; lVar10 < w; lVar10 = lVar10 + 0x20) {
                local_80 = *(undefined1 (*) [32])(mask + lVar10);
                auVar20[8] = 0x40;
                auVar20._0_8_ = 0x4040404040404040;
                auVar20[9] = 0x40;
                auVar20[10] = 0x40;
                auVar20[0xb] = 0x40;
                auVar20[0xc] = 0x40;
                auVar20[0xd] = 0x40;
                auVar20[0xe] = 0x40;
                auVar20[0xf] = 0x40;
                auVar20[0x10] = 0x40;
                auVar20[0x11] = 0x40;
                auVar20[0x12] = 0x40;
                auVar20[0x13] = 0x40;
                auVar20[0x14] = 0x40;
                auVar20[0x15] = 0x40;
                auVar20[0x16] = 0x40;
                auVar20[0x17] = 0x40;
                auVar20[0x18] = 0x40;
                auVar20[0x19] = 0x40;
                auVar20[0x1a] = 0x40;
                auVar20[0x1b] = 0x40;
                auVar20[0x1c] = 0x40;
                auVar20[0x1d] = 0x40;
                auVar20[0x1e] = 0x40;
                auVar20[0x1f] = 0x40;
                alVar21 = (__m256i)vpsubb_avx2(auVar20,local_80);
                local_a0 = alVar21;
                blend_32_u8_avx2((__m256i *)(src0 + lVar10),
                                 (uint8_t *)((long)*(__m256i *)src1 + lVar10),local_80,&local_a0,
                                 (__m256i *)src1,(int32_t)uVar6);
                *(__m256i *)(dst + lVar10) = alVar21;
              }
              dst = dst + dst_stride;
              src0 = src0 + src0_stride;
              src1 = (uint8_t *)((long)*(__m256i *)src1 + (ulong)src1_stride);
              mask = mask + uVar9;
              h = h + -1;
            } while (h != 0);
          }
        }
        else {
          uVar6 = (ulong)src1_stride;
          uVar7 = (ulong)(mask_stride * 2);
          if (w == 4) {
            auVar17[8] = 0x40;
            auVar17._0_8_ = 0x4040404040404040;
            auVar17[9] = 0x40;
            auVar17[10] = 0x40;
            auVar17[0xb] = 0x40;
            auVar17[0xc] = 0x40;
            auVar17[0xd] = 0x40;
            auVar17[0xe] = 0x40;
            auVar17[0xf] = 0x40;
            auVar30._8_2_ = 0x200;
            auVar30._0_8_ = 0x200020002000200;
            auVar30._10_2_ = 0x200;
            auVar30._12_2_ = 0x200;
            auVar30._14_2_ = 0x200;
            do {
              auVar12 = vpavgb_avx(ZEXT416(*(uint *)mask),ZEXT416(*(uint *)((long)mask + uVar9)));
              auVar32 = vpsubb_avx(auVar17,auVar12);
              auVar50 = vpunpcklbw_avx(ZEXT416(*(uint *)src0),ZEXT416(*(uint *)src1));
              auVar12 = vpunpcklbw_avx(auVar12,auVar32);
              auVar12 = vpmaddubsw_avx(auVar50,auVar12);
              auVar12 = vpmulhrsw_avx(auVar12,auVar30);
              auVar12 = vpackuswb_avx(auVar12,auVar12);
              *(int *)dst = auVar12._0_4_;
              dst = dst + dst_stride;
              src0 = (uint8_t *)((long)src0 + (ulong)src0_stride);
              src1 = (uint8_t *)((long)src1 + uVar6);
              mask = (uint8_t *)((long)mask + uVar7);
              h = h + -1;
            } while (h != 0);
          }
          else if (w == 0x10) {
            auVar16._8_2_ = 0x4040;
            auVar16._0_8_ = 0x4040404040404040;
            auVar16._10_2_ = 0x4040;
            auVar16._12_2_ = 0x4040;
            auVar16._14_2_ = 0x4040;
            auVar29._8_2_ = 0x200;
            auVar29._0_8_ = 0x200020002000200;
            auVar29._10_2_ = 0x200;
            auVar29._12_2_ = 0x200;
            auVar29._14_2_ = 0x200;
            do {
              auVar12 = vpavgb_avx(*(undefined1 (*) [16])mask,
                                   *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + uVar9));
              auVar50 = vpsubw_avx(auVar16,auVar12);
              auVar32 = vpunpcklbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
              auVar31 = vpunpcklbw_avx(auVar12,auVar50);
              auVar32 = vpmaddubsw_avx(auVar32,auVar31);
              auVar31 = vpunpckhbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
              auVar12 = vpunpckhbw_avx(auVar12,auVar50);
              auVar12 = vpmaddubsw_avx(auVar31,auVar12);
              auVar32 = vpmulhrsw_avx(auVar32,auVar29);
              auVar12 = vpmulhrsw_avx(auVar12,auVar29);
              auVar12 = vpackuswb_avx(auVar32,auVar12);
              *(undefined1 (*) [16])dst = auVar12;
              dst = *(undefined1 (*) [16])dst + dst_stride;
              src0 = *(undefined1 (*) [16])src0 + src0_stride;
              src1 = *(undefined1 (*) [16])src1 + uVar6;
              mask = *(undefined1 (*) [16])mask + uVar7;
              h = h + -1;
            } while (h != 0);
          }
          else if (w == 8) {
            auVar13[8] = 0x40;
            auVar13._0_8_ = 0x4040404040404040;
            auVar13[9] = 0x40;
            auVar13[10] = 0x40;
            auVar13[0xb] = 0x40;
            auVar13[0xc] = 0x40;
            auVar13[0xd] = 0x40;
            auVar13[0xe] = 0x40;
            auVar13[0xf] = 0x40;
            auVar25._8_2_ = 0x200;
            auVar25._0_8_ = 0x200020002000200;
            auVar25._10_2_ = 0x200;
            auVar25._12_2_ = 0x200;
            auVar25._14_2_ = 0x200;
            do {
              auVar33._8_8_ = 0;
              auVar33._0_8_ = *(ulong *)mask;
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)((long)mask + uVar9);
              auVar12 = vpavgb_avx(auVar33,auVar41);
              auVar32 = vpsubb_avx(auVar13,auVar12);
              auVar46._8_8_ = 0;
              auVar46._0_8_ = *(ulong *)src0;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = *(ulong *)src1;
              auVar50 = vpunpcklbw_avx(auVar46,auVar52);
              auVar12 = vpunpcklbw_avx(auVar12,auVar32);
              auVar12 = vpmaddubsw_avx(auVar50,auVar12);
              auVar12 = vpmulhrsw_avx(auVar12,auVar25);
              auVar12 = vpackuswb_avx(auVar12,auVar12);
              *(long *)dst = auVar12._0_8_;
              dst = dst + dst_stride;
              src0 = (uint8_t *)((long)src0 + (ulong)src0_stride);
              src1 = (uint8_t *)((long)src1 + (ulong)src1_stride);
              mask = (uint8_t *)((long)mask + uVar7);
              h = h + -1;
            } while (h != 0);
          }
          else {
            local_138 = mask + uVar9;
            do {
              for (lVar10 = 0;
                  lVar10 < CONCAT17(cStack_bc,CONCAT16(cStack_bc,CONCAT15(cStack_bc,(int5)w)));
                  lVar10 = lVar10 + 0x20) {
                local_80 = vpavgb_avx2(*(undefined1 (*) [32])(mask + lVar10),
                                       *(undefined1 (*) [32])(local_138 + lVar10));
                auVar1[8] = 0x40;
                auVar1._0_8_ = 0x4040404040404040;
                auVar1[9] = 0x40;
                auVar1[10] = 0x40;
                auVar1[0xb] = 0x40;
                auVar1[0xc] = 0x40;
                auVar1[0xd] = 0x40;
                auVar1[0xe] = 0x40;
                auVar1[0xf] = 0x40;
                auVar1[0x10] = 0x40;
                auVar1[0x11] = 0x40;
                auVar1[0x12] = 0x40;
                auVar1[0x13] = 0x40;
                auVar1[0x14] = 0x40;
                auVar1[0x15] = 0x40;
                auVar1[0x16] = 0x40;
                auVar1[0x17] = 0x40;
                auVar1[0x18] = 0x40;
                auVar1[0x19] = 0x40;
                auVar1[0x1a] = 0x40;
                auVar1[0x1b] = 0x40;
                auVar1[0x1c] = 0x40;
                auVar1[0x1d] = 0x40;
                auVar1[0x1e] = 0x40;
                auVar1[0x1f] = 0x40;
                alVar21 = (__m256i)vpsubb_avx2(auVar1,local_80);
                local_a0 = alVar21;
                blend_32_u8_avx2((__m256i *)(src0 + lVar10),
                                 (uint8_t *)((long)*(__m256i *)src1 + lVar10),local_80,&local_a0,
                                 (__m256i *)src1,(int32_t)uVar6);
                *(__m256i *)(dst + lVar10) = alVar21;
              }
              dst = dst + dst_stride;
              src0 = src0 + src0_stride;
              src1 = (uint8_t *)((long)*(__m256i *)src1 + (ulong)src1_stride);
              mask = mask + uVar7;
              local_138 = local_138 + uVar7;
              h = h + -1;
            } while (h != 0);
          }
        }
      }
      else {
        uVar6 = (ulong)src0_stride;
        uVar7 = (ulong)src1_stride;
        if (w == 4) {
          auVar14._8_8_ = 0x8080808006040200;
          auVar14._0_8_ = 0x8080808006040200;
          auVar27._8_8_ = 0x8080808007050301;
          auVar27._0_8_ = 0x8080808007050301;
          auVar35[8] = 0x40;
          auVar35._0_8_ = 0x4040404040404040;
          auVar35[9] = 0x40;
          auVar35[10] = 0x40;
          auVar35[0xb] = 0x40;
          auVar35[0xc] = 0x40;
          auVar35[0xd] = 0x40;
          auVar35[0xe] = 0x40;
          auVar35[0xf] = 0x40;
          auVar42._8_2_ = 0x200;
          auVar42._0_8_ = 0x200020002000200;
          auVar42._10_2_ = 0x200;
          auVar42._12_2_ = 0x200;
          auVar42._14_2_ = 0x200;
          do {
            auVar48._8_8_ = 0;
            auVar48._0_8_ = *(ulong *)mask;
            auVar12 = vpshufb_avx(auVar48,auVar14);
            auVar32 = vpshufb_avx(auVar48,auVar27);
            auVar12 = vpavgb_avx(auVar12,auVar32);
            auVar32 = vpsubb_avx(auVar35,auVar12);
            auVar50 = vpunpcklbw_avx(ZEXT416(*(uint *)src0),ZEXT416(*(uint *)src1));
            auVar12 = vpunpcklbw_avx(auVar12,auVar32);
            auVar12 = vpmaddubsw_avx(auVar50,auVar12);
            auVar12 = vpmulhrsw_avx(auVar12,auVar42);
            auVar12 = vpackuswb_avx(auVar12,auVar12);
            *(int *)dst = auVar12._0_4_;
            dst = dst + dst_stride;
            src0 = (uint8_t *)((long)src0 + uVar6);
            src1 = (uint8_t *)((long)src1 + uVar7);
            mask = (uint8_t *)((long)mask + uVar9);
            h = h + -1;
          } while (h != 0);
        }
        else if (w == 8) {
          auVar26[8] = 0x40;
          auVar26._0_8_ = 0x4040404040404040;
          auVar26[9] = 0x40;
          auVar26[10] = 0x40;
          auVar26[0xb] = 0x40;
          auVar26[0xc] = 0x40;
          auVar26[0xd] = 0x40;
          auVar26[0xe] = 0x40;
          auVar26[0xf] = 0x40;
          auVar34._8_2_ = 0x200;
          auVar34._0_8_ = 0x200020002000200;
          auVar34._10_2_ = 0x200;
          auVar34._12_2_ = 0x200;
          auVar34._14_2_ = 0x200;
          do {
            auVar32 = vpshufb_avx(*(undefined1 (*) [16])mask,auVar12);
            auVar47._8_8_ = auVar32._0_8_;
            auVar47._0_8_ = auVar32._0_8_;
            auVar32 = vpshufd_avx(auVar32,0xee);
            auVar32 = vpavgb_avx(auVar47,auVar32);
            auVar50 = vpsubb_avx(auVar26,auVar32);
            auVar53._8_8_ = 0;
            auVar53._0_8_ = *(ulong *)src0;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = *(ulong *)src1;
            auVar31 = vpunpcklbw_avx(auVar53,auVar57);
            auVar32 = vpunpcklbw_avx(auVar32,auVar50);
            auVar32 = vpmaddubsw_avx(auVar31,auVar32);
            auVar32 = vpmulhrsw_avx(auVar32,auVar34);
            auVar32 = vpackuswb_avx(auVar32,auVar32);
            *(long *)dst = auVar32._0_8_;
            dst = dst + dst_stride;
            src0 = (uint8_t *)((long)src0 + uVar6);
            src1 = (uint8_t *)((long)src1 + uVar7);
            mask = *(undefined1 (*) [16])mask + uVar9;
            h = h + -1;
          } while (h != 0);
        }
        else if (w == 0x10) {
          auVar18._8_2_ = 0xff;
          auVar18._0_8_ = 0xff00ff00ff00ff;
          auVar18._10_2_ = 0xff;
          auVar18._12_2_ = 0xff;
          auVar18._14_2_ = 0xff;
          auVar18._16_2_ = 0xff;
          auVar18._18_2_ = 0xff;
          auVar18._20_2_ = 0xff;
          auVar18._22_2_ = 0xff;
          auVar18._24_2_ = 0xff;
          auVar18._26_2_ = 0xff;
          auVar18._28_2_ = 0xff;
          auVar18._30_2_ = 0xff;
          auVar37[8] = 0x40;
          auVar37._0_8_ = 0x4040404040404040;
          auVar37[9] = 0x40;
          auVar37[10] = 0x40;
          auVar37[0xb] = 0x40;
          auVar37[0xc] = 0x40;
          auVar37[0xd] = 0x40;
          auVar37[0xe] = 0x40;
          auVar37[0xf] = 0x40;
          auVar37[0x10] = 0x40;
          auVar37[0x11] = 0x40;
          auVar37[0x12] = 0x40;
          auVar37[0x13] = 0x40;
          auVar37[0x14] = 0x40;
          auVar37[0x15] = 0x40;
          auVar37[0x16] = 0x40;
          auVar37[0x17] = 0x40;
          auVar37[0x18] = 0x40;
          auVar37[0x19] = 0x40;
          auVar37[0x1a] = 0x40;
          auVar37[0x1b] = 0x40;
          auVar37[0x1c] = 0x40;
          auVar37[0x1d] = 0x40;
          auVar37[0x1e] = 0x40;
          auVar37[0x1f] = 0x40;
          do {
            auVar20 = vpsrlw_avx2(*(undefined1 (*) [32])mask,8);
            auVar20 = vpavgb_avx2(*(undefined1 (*) [32])mask,auVar20);
            auVar20 = vpand_avx2(auVar20,auVar18);
            auVar20 = vpackuswb_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar1 = vpsubb_avx2(auVar37,auVar20);
            auVar12 = vpunpckhbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
            auVar32 = vpunpcklbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
            auVar55._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar32;
            auVar55._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar12;
            auVar20 = vpunpcklbw_avx2(auVar20,auVar1);
            auVar20 = vpmaddubsw_avx2(auVar55,auVar20);
            auVar20 = vpsrlw_avx2(auVar20,5);
            auVar20 = vpavgw_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar12 = vpackuswb_avx(auVar20._0_16_,auVar20._16_16_);
            *(undefined1 (*) [16])dst = auVar12;
            dst = *(undefined1 (*) [16])dst + dst_stride;
            src0 = *(undefined1 (*) [16])src0 + uVar6;
            src1 = *(undefined1 (*) [16])src1 + uVar7;
            mask = *(undefined1 (*) [32])mask + uVar9;
            h = h + -1;
          } while (h != 0);
        }
        else {
          do {
            uVar6 = (ulong)src1_stride;
            for (lVar10 = 0; lVar10 < w; lVar10 = lVar10 + 0x20) {
              auVar38._16_16_ = _DAT_00468b70;
              auVar38._0_16_ = _DAT_00468b70;
              auVar20 = vpshufb_avx2(*(undefined1 (*) [32])(mask + lVar10 * 2),auVar38);
              auVar1 = vpshufb_avx2(*(undefined1 (*) [32])(mask + lVar10 * 2 + 0x20),auVar38);
              auVar2 = vpunpckhqdq_avx2(auVar20,auVar1);
              auVar20 = vpunpcklqdq_avx2(auVar20,auVar1);
              auVar20 = vpavgb_avx2(auVar20,auVar2);
              local_80 = vpermq_avx2(auVar20,0xd8);
              auVar2[8] = 0x40;
              auVar2._0_8_ = 0x4040404040404040;
              auVar2[9] = 0x40;
              auVar2[10] = 0x40;
              auVar2[0xb] = 0x40;
              auVar2[0xc] = 0x40;
              auVar2[0xd] = 0x40;
              auVar2[0xe] = 0x40;
              auVar2[0xf] = 0x40;
              auVar2[0x10] = 0x40;
              auVar2[0x11] = 0x40;
              auVar2[0x12] = 0x40;
              auVar2[0x13] = 0x40;
              auVar2[0x14] = 0x40;
              auVar2[0x15] = 0x40;
              auVar2[0x16] = 0x40;
              auVar2[0x17] = 0x40;
              auVar2[0x18] = 0x40;
              auVar2[0x19] = 0x40;
              auVar2[0x1a] = 0x40;
              auVar2[0x1b] = 0x40;
              auVar2[0x1c] = 0x40;
              auVar2[0x1d] = 0x40;
              auVar2[0x1e] = 0x40;
              auVar2[0x1f] = 0x40;
              alVar21 = (__m256i)vpsubb_avx2(auVar2,local_80);
              local_a0 = alVar21;
              blend_32_u8_avx2((__m256i *)(src0 + lVar10),
                               (uint8_t *)((long)*(__m256i *)src1 + lVar10),local_80,&local_a0,
                               (__m256i *)src1,(int32_t)uVar6);
              *(__m256i *)(dst + lVar10) = alVar21;
            }
            dst = dst + dst_stride;
            src0 = src0 + src0_stride;
            src1 = (uint8_t *)((long)*(__m256i *)src1 + (ulong)src1_stride);
            mask = mask + uVar9;
            h = h + -1;
          } while (h != 0);
        }
      }
    }
    else {
      uVar7 = (ulong)src0_stride;
      uVar8 = (ulong)src1_stride;
      uVar6 = (ulong)(mask_stride * 2);
      if (w == 4) {
        auVar24[8] = 0x7f;
        auVar24._0_8_ = 0x7f7f7f7f7f7f7f7f;
        auVar24[9] = 0x7f;
        auVar24[10] = 0x7f;
        auVar24[0xb] = 0x7f;
        auVar24[0xc] = 0x7f;
        auVar24[0xd] = 0x7f;
        auVar24[0xe] = 0x7f;
        auVar24[0xf] = 0x7f;
        auVar40[8] = 0x40;
        auVar40._0_8_ = 0x4040404040404040;
        auVar40[9] = 0x40;
        auVar40[10] = 0x40;
        auVar40[0xb] = 0x40;
        auVar40[0xc] = 0x40;
        auVar40[0xd] = 0x40;
        auVar40[0xe] = 0x40;
        auVar40[0xf] = 0x40;
        auVar45._8_2_ = 0x200;
        auVar45._0_8_ = 0x200020002000200;
        auVar45._10_2_ = 0x200;
        auVar45._12_2_ = 0x200;
        auVar45._14_2_ = 0x200;
        do {
          auVar51._8_8_ = 0;
          auVar51._0_8_ = *(ulong *)mask;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)((long)mask + uVar9);
          auVar32 = vpaddb_avx(auVar56,auVar51);
          auVar50 = vpshufb_avx(auVar32,auVar12);
          auVar31 = vpshufd_avx(auVar50,0xee);
          auVar32 = vpand_avx(auVar50,auVar31);
          auVar50 = vpsrlw_avx(auVar50 ^ auVar31,1);
          auVar50 = vpand_avx(auVar50,auVar24);
          auVar32 = vpaddb_avx(auVar32,auVar50);
          auVar32 = vpmovzxbw_avx(auVar32);
          auVar32 = vpavgw_avx(auVar32,(undefined1  [16])0x0);
          auVar32 = vpackuswb_avx(auVar32,auVar32);
          auVar50 = vpsubb_avx(auVar40,auVar32);
          auVar31 = vpunpcklbw_avx(ZEXT416(*(uint *)src0),ZEXT416(*(uint *)src1));
          auVar32 = vpunpcklbw_avx(auVar32,auVar50);
          auVar32 = vpmaddubsw_avx(auVar31,auVar32);
          auVar32 = vpmulhrsw_avx(auVar32,auVar45);
          auVar32 = vpackuswb_avx(auVar32,auVar32);
          *(int *)dst = auVar32._0_4_;
          dst = dst + dst_stride;
          src0 = (uint8_t *)((long)src0 + uVar7);
          src1 = (uint8_t *)((long)src1 + uVar8);
          mask = (uint8_t *)((long)mask + uVar6);
          h = h + -1;
        } while (h != 0);
      }
      else if (w == 0x10) {
        auVar19._8_2_ = 0xff;
        auVar19._0_8_ = 0xff00ff00ff00ff;
        auVar19._10_2_ = 0xff;
        auVar19._12_2_ = 0xff;
        auVar19._14_2_ = 0xff;
        auVar19._16_2_ = 0xff;
        auVar19._18_2_ = 0xff;
        auVar19._20_2_ = 0xff;
        auVar19._22_2_ = 0xff;
        auVar19._24_2_ = 0xff;
        auVar19._26_2_ = 0xff;
        auVar19._28_2_ = 0xff;
        auVar19._30_2_ = 0xff;
        auVar23[8] = 0x7f;
        auVar23._0_8_ = 0x7f7f7f7f7f7f7f7f;
        auVar23[9] = 0x7f;
        auVar23[10] = 0x7f;
        auVar23[0xb] = 0x7f;
        auVar23[0xc] = 0x7f;
        auVar23[0xd] = 0x7f;
        auVar23[0xe] = 0x7f;
        auVar23[0xf] = 0x7f;
        auVar43[8] = 0x40;
        auVar43._0_8_ = 0x4040404040404040;
        auVar43[9] = 0x40;
        auVar43[10] = 0x40;
        auVar43[0xb] = 0x40;
        auVar43[0xc] = 0x40;
        auVar43[0xd] = 0x40;
        auVar43[0xe] = 0x40;
        auVar43[0xf] = 0x40;
        auVar43[0x10] = 0x40;
        auVar43[0x11] = 0x40;
        auVar43[0x12] = 0x40;
        auVar43[0x13] = 0x40;
        auVar43[0x14] = 0x40;
        auVar43[0x15] = 0x40;
        auVar43[0x16] = 0x40;
        auVar43[0x17] = 0x40;
        auVar43[0x18] = 0x40;
        auVar43[0x19] = 0x40;
        auVar43[0x1a] = 0x40;
        auVar43[0x1b] = 0x40;
        auVar43[0x1c] = 0x40;
        auVar43[0x1d] = 0x40;
        auVar43[0x1e] = 0x40;
        auVar43[0x1f] = 0x40;
        do {
          auVar20 = vpaddb_avx2(*(undefined1 (*) [32])(*(undefined1 (*) [32])mask + uVar9),
                                *(undefined1 (*) [32])mask);
          auVar1 = vpand_avx2(auVar20,auVar19);
          auVar12 = vpackuswb_avx(auVar1._0_16_,auVar1._16_16_);
          auVar20 = vpsrlw_avx2(auVar20,8);
          auVar32 = vpackuswb_avx(auVar20._0_16_,auVar20._16_16_);
          auVar50 = vpand_avx(auVar32,auVar12);
          auVar12 = vpsrlw_avx(auVar32 ^ auVar12,1);
          auVar12 = vpand_avx(auVar12,auVar23);
          auVar12 = vpaddb_avx(auVar50,auVar12);
          auVar20 = vpmovzxbw_avx2(auVar12);
          auVar20 = vpavgw_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar20 = vpackuswb_avx2(auVar20,auVar20);
          auVar1 = vpsubb_avx2(auVar43,auVar20);
          auVar12 = vpunpckhbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
          auVar32 = vpunpcklbw_avx(*(undefined1 (*) [16])src0,*(undefined1 (*) [16])src1);
          auVar58._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar32;
          auVar58._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar12;
          auVar20 = vpunpcklbw_avx2(auVar20,auVar1);
          auVar20 = vpmaddubsw_avx2(auVar58,auVar20);
          auVar20 = vpsrlw_avx2(auVar20,5);
          auVar20 = vpavgw_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar12 = vpackuswb_avx(auVar20._0_16_,auVar20._16_16_);
          *(undefined1 (*) [16])dst = auVar12;
          dst = *(undefined1 (*) [16])dst + dst_stride;
          src0 = *(undefined1 (*) [16])src0 + uVar7;
          src1 = *(undefined1 (*) [16])src1 + uVar8;
          mask = *(undefined1 (*) [32])mask + uVar6;
          h = h + -1;
        } while (h != 0);
      }
      else if (w == 8) {
        auVar22[8] = 0x7f;
        auVar22._0_8_ = 0x7f7f7f7f7f7f7f7f;
        auVar22[9] = 0x7f;
        auVar22[10] = 0x7f;
        auVar22[0xb] = 0x7f;
        auVar22[0xc] = 0x7f;
        auVar22[0xd] = 0x7f;
        auVar22[0xe] = 0x7f;
        auVar22[0xf] = 0x7f;
        auVar39[8] = 0x40;
        auVar39._0_8_ = 0x4040404040404040;
        auVar39[9] = 0x40;
        auVar39[10] = 0x40;
        auVar39[0xb] = 0x40;
        auVar39[0xc] = 0x40;
        auVar39[0xd] = 0x40;
        auVar39[0xe] = 0x40;
        auVar39[0xf] = 0x40;
        auVar44._8_2_ = 0x200;
        auVar44._0_8_ = 0x200020002000200;
        auVar44._10_2_ = 0x200;
        auVar44._12_2_ = 0x200;
        auVar44._14_2_ = 0x200;
        do {
          auVar32 = vpaddb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])mask + uVar9),
                               *(undefined1 (*) [16])mask);
          auVar50 = vpshufb_avx(auVar32,auVar12);
          auVar31 = vpshufd_avx(auVar50,0xee);
          auVar32 = vpand_avx(auVar50,auVar31);
          auVar50 = vpsrlw_avx(auVar50 ^ auVar31,1);
          auVar50 = vpand_avx(auVar50,auVar22);
          auVar32 = vpaddb_avx(auVar32,auVar50);
          auVar32 = vpmovzxbw_avx(auVar32);
          auVar32 = vpavgw_avx(auVar32,(undefined1  [16])0x0);
          auVar32 = vpackuswb_avx(auVar32,auVar32);
          auVar50 = vpsubb_avx(auVar39,auVar32);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)src0;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)src1;
          auVar31 = vpunpcklbw_avx(auVar59,auVar60);
          auVar32 = vpunpcklbw_avx(auVar32,auVar50);
          auVar32 = vpmaddubsw_avx(auVar31,auVar32);
          auVar32 = vpmulhrsw_avx(auVar32,auVar44);
          auVar32 = vpackuswb_avx(auVar32,auVar32);
          *(long *)dst = auVar32._0_8_;
          dst = dst + dst_stride;
          src0 = (uint8_t *)((long)src0 + uVar7);
          src1 = (uint8_t *)((long)src1 + uVar8);
          mask = *(undefined1 (*) [16])mask + uVar6;
          h = h + -1;
        } while (h != 0);
      }
      else {
        local_60 = (ulong)dst_stride;
        puVar11 = mask + uVar9 + 0x20;
        uVar9 = uVar8;
        do {
          for (lVar10 = 0;
              lVar10 < CONCAT17(cStack_bc,CONCAT16(cStack_bc,CONCAT15(cStack_bc,(int5)w)));
              lVar10 = lVar10 + 0x20) {
            auVar20 = vpaddb_avx2(*(undefined1 (*) [32])(puVar11 + lVar10 * 2 + -0x20),
                                  *(undefined1 (*) [32])(mask + lVar10 * 2));
            auVar1 = vpaddb_avx2(*(undefined1 (*) [32])(puVar11 + lVar10 * 2),
                                 *(undefined1 (*) [32])(mask + lVar10 * 2 + 0x20));
            auVar5[8] = 0xff;
            auVar5._0_8_ = 0xff00ff00ff00ff;
            auVar5[9] = 0;
            auVar5[10] = 0xff;
            auVar5[0xb] = 0;
            auVar5[0xc] = 0xff;
            auVar5[0xd] = 0;
            auVar5[0xe] = 0xff;
            auVar5[0xf] = 0;
            auVar5[0x10] = 0xff;
            auVar5[0x11] = 0;
            auVar5[0x12] = 0xff;
            auVar5[0x13] = 0;
            auVar5[0x14] = 0xff;
            auVar5[0x15] = 0;
            auVar5[0x16] = 0xff;
            auVar5[0x17] = 0;
            auVar5[0x18] = 0xff;
            auVar5[0x19] = 0;
            auVar5[0x1a] = 0xff;
            auVar5[0x1b] = 0;
            auVar5[0x1c] = 0xff;
            auVar5[0x1d] = 0;
            auVar5[0x1e] = 0xff;
            auVar5[0x1f] = 0;
            auVar2 = vpand_avx2(auVar20,auVar5);
            auVar12 = vpackuswb_avx(auVar2._0_16_,auVar2._16_16_);
            auVar20 = vpsrlw_avx2(auVar20,8);
            auVar32 = vpackuswb_avx(auVar20._0_16_,auVar20._16_16_);
            auVar50 = vpand_avx(auVar32,auVar12);
            auVar12 = vpsrlw_avx(auVar32 ^ auVar12,1);
            auVar3[8] = 0x7f;
            auVar3._0_8_ = 0x7f7f7f7f7f7f7f7f;
            auVar3[9] = 0x7f;
            auVar3[10] = 0x7f;
            auVar3[0xb] = 0x7f;
            auVar3[0xc] = 0x7f;
            auVar3[0xd] = 0x7f;
            auVar3[0xe] = 0x7f;
            auVar3[0xf] = 0x7f;
            auVar12 = vpand_avx(auVar12,auVar3);
            auVar12 = vpaddb_avx(auVar50,auVar12);
            auVar20 = vpmovzxbw_avx2(auVar12);
            auVar2 = vpavgw_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar20 = vpand_avx2(auVar1,auVar5);
            auVar12 = vpackuswb_avx(auVar20._0_16_,auVar20._16_16_);
            auVar20 = vpsrlw_avx2(auVar1,8);
            auVar32 = vpackuswb_avx(auVar20._0_16_,auVar20._16_16_);
            auVar50 = vpand_avx(auVar32,auVar12);
            auVar12 = vpsrlw_avx(auVar32 ^ auVar12,1);
            auVar12 = vpand_avx(auVar12,auVar3);
            auVar12 = vpaddb_avx(auVar50,auVar12);
            auVar20 = vpmovzxbw_avx2(auVar12);
            auVar20 = vpavgw_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar20 = vpackuswb_avx2(auVar2,auVar20);
            local_80 = vpermq_avx2(auVar20,0xd8);
            auVar4[8] = 0x40;
            auVar4._0_8_ = 0x4040404040404040;
            auVar4[9] = 0x40;
            auVar4[10] = 0x40;
            auVar4[0xb] = 0x40;
            auVar4[0xc] = 0x40;
            auVar4[0xd] = 0x40;
            auVar4[0xe] = 0x40;
            auVar4[0xf] = 0x40;
            auVar4[0x10] = 0x40;
            auVar4[0x11] = 0x40;
            auVar4[0x12] = 0x40;
            auVar4[0x13] = 0x40;
            auVar4[0x14] = 0x40;
            auVar4[0x15] = 0x40;
            auVar4[0x16] = 0x40;
            auVar4[0x17] = 0x40;
            auVar4[0x18] = 0x40;
            auVar4[0x19] = 0x40;
            auVar4[0x1a] = 0x40;
            auVar4[0x1b] = 0x40;
            auVar4[0x1c] = 0x40;
            auVar4[0x1d] = 0x40;
            auVar4[0x1e] = 0x40;
            auVar4[0x1f] = 0x40;
            alVar21 = (__m256i)vpsubb_avx2(auVar4,local_80);
            local_a0 = alVar21;
            blend_32_u8_avx2((__m256i *)(src0 + lVar10),(uint8_t *)((long)*(__m256i *)src1 + lVar10)
                             ,local_80,&local_a0,(__m256i *)src1,(int32_t)uVar9);
            *(__m256i *)(dst + lVar10) = alVar21;
          }
          dst = dst + local_60;
          src0 = src0 + uVar7;
          src1 = (uint8_t *)((long)*(__m256i *)src1 + uVar8);
          mask = mask + uVar6;
          puVar11 = puVar11 + uVar6;
          h = h + -1;
        } while (h != 0);
      }
    }
  }
  else {
    aom_blend_a64_mask_c
              (dst,dst_stride,src0,src0_stride,src1,src1_stride,mask,mask_stride,w,h,subw,subh);
  }
  return;
}

Assistant:

void aom_blend_a64_mask_avx2(uint8_t *dst, uint32_t dst_stride,
                             const uint8_t *src0, uint32_t src0_stride,
                             const uint8_t *src1, uint32_t src1_stride,
                             const uint8_t *mask, uint32_t mask_stride, int w,
                             int h, int subw, int subh) {
  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (UNLIKELY((h | w) & 3)) {  // if (w <= 2 || h <= 2)
    aom_blend_a64_mask_c(dst, dst_stride, src0, src0_stride, src1, src1_stride,
                         mask, mask_stride, w, h, subw, subh);
  } else {
    if (subw & subh) {
      blend_a64_mask_sx_sy_avx2(dst, dst_stride, src0, src0_stride, src1,
                                src1_stride, mask, mask_stride, w, h);
    } else if (subw) {
      blend_a64_mask_sx_avx2(dst, dst_stride, src0, src0_stride, src1,
                             src1_stride, mask, mask_stride, w, h);
    } else if (subh) {
      blend_a64_mask_sy_avx2(dst, dst_stride, src0, src0_stride, src1,
                             src1_stride, mask, mask_stride, w, h);
    } else {
      blend_a64_mask_avx2(dst, dst_stride, src0, src0_stride, src1, src1_stride,
                          mask, mask_stride, w, h);
    }
  }
}